

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio_json_parser.h
# Opt level: O3

size_t fio_json_parse(json_parser_s *parser,char *buffer,size_t length)

{
  json_parser_s *pjVar1;
  byte *start;
  byte *pbVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  json_parser_s jVar7;
  json_parser_s jVar8;
  byte *pbVar9;
  int *piVar10;
  uint8_t *alignment;
  long lVar11;
  byte *pbVar12;
  json_parser_s jVar13;
  json_parser_s jVar14;
  byte *pbVar15;
  byte *pbVar16;
  FIOBJ o;
  ulong uVar17;
  byte *pbVar18;
  fiobj_json_parser_s *pr;
  bool bVar19;
  double num;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint8_t *tmp;
  byte *local_58;
  json_parser_s local_50;
  char *local_48;
  byte *local_40;
  char *local_38;
  
  if (buffer == (char *)0x0 || length == 0) {
    return 0;
  }
  pbVar2 = (byte *)(buffer + length);
  pjVar1 = parser + 4;
  local_40 = (byte *)((ulong)pbVar2 & 0xfffffffffffffff8);
  local_48 = buffer + (length - 1);
  local_38 = buffer;
LAB_0016036a:
  while ((buffer < pbVar2 && (""[(byte)*buffer] != '\0'))) {
    buffer = (char *)((byte *)buffer + 1);
  }
  pbVar18 = pbVar2;
  if ((byte *)buffer == pbVar2) goto LAB_00160ce9;
  bVar4 = *buffer;
  pbVar18 = (byte *)buffer;
  if (bVar4 < 0x5d) {
    switch(bVar4) {
    case 0x22:
      start = (byte *)buffer + 1;
      pbVar16 = start;
      if (start < pbVar2) {
        do {
          bVar4 = *pbVar16;
          if (""[bVar4] == '\0') {
            uVar17 = (ulong)pbVar16 & 0xfffffffffffffff8;
            pbVar9 = (byte *)(uVar17 + 8);
            if (pbVar9 < pbVar2) {
              if (pbVar16 < pbVar9 && pbVar9 <= pbVar2) {
                pbVar12 = pbVar16 + (-8 - uVar17);
                pbVar15 = pbVar16;
                do {
                  pbVar16 = pbVar15;
                  bVar4 = *pbVar16;
                  uVar17 = (ulong)bVar4;
                  if (""[uVar17] != '\0') goto LAB_001609ee;
                  pbVar15 = pbVar16 + 1;
                  pbVar12 = pbVar12 + 1;
                  pbVar16 = pbVar9;
                } while (pbVar12 != (byte *)0x0);
              }
              if (pbVar16 < local_40) {
                uVar3 = *(undefined8 *)pbVar16;
                auVar23._8_4_ = (int)uVar3;
                auVar23._0_8_ = uVar3;
                auVar23._12_4_ = (int)((ulong)uVar3 >> 0x20);
                auVar21 = (auVar23 ^ _DAT_00171810) & _DAT_00171820;
                auVar22._0_8_ = auVar21._0_8_ + 0x101010101010101;
                auVar22._8_8_ = auVar21._8_8_ + 0x101010101010101;
                auVar23 = auVar22 & (auVar23 ^ _DAT_00171810) & _DAT_00171840;
                auVar21._0_4_ = -(uint)(auVar23._0_4_ == 0);
                auVar21._4_4_ = -(uint)(auVar23._4_4_ == 0);
                auVar21._8_4_ = -(uint)(auVar23._8_4_ == 0);
                auVar21._12_4_ = -(uint)(auVar23._12_4_ == 0);
                iVar5 = movmskps((int)uVar17,auVar21);
                if (iVar5 == 0xf) {
                  uVar6 = 0;
                  do {
                    pbVar16 = pbVar16 + 8;
                    if (local_40 <= pbVar16) break;
                    uVar3 = *(undefined8 *)pbVar16;
                    auVar20._8_4_ = (int)uVar3;
                    auVar20._0_8_ = uVar3;
                    auVar20._12_4_ = (int)((ulong)uVar3 >> 0x20);
                    auVar23 = (auVar20 ^ _DAT_00171810) & _DAT_00171820;
                    auVar24._0_8_ = auVar23._0_8_ + 0x101010101010101;
                    auVar24._8_8_ = auVar23._8_8_ + 0x101010101010101;
                    auVar23 = auVar24 & (auVar20 ^ _DAT_00171810) & _DAT_00171840;
                    auVar25._0_4_ = -(uint)(auVar23._0_4_ == 0);
                    auVar25._4_4_ = -(uint)(auVar23._4_4_ == 0);
                    auVar25._8_4_ = -(uint)(auVar23._8_4_ == 0);
                    auVar25._12_4_ = -(uint)(auVar23._12_4_ == 0);
                    uVar6 = movmskps(uVar6,auVar25);
                    uVar6 = uVar6 ^ 0xf;
                  } while (uVar6 == 0);
                }
              }
            }
            pbVar9 = pbVar16;
            if (pbVar16 + 4 <= pbVar2) {
              bVar4 = *pbVar16;
              if (""[bVar4] == '\0') {
                bVar4 = pbVar16[1];
                if (""[bVar4] == '\0') {
                  bVar4 = pbVar16[2];
                  if (""[bVar4] == '\0') {
                    bVar4 = pbVar16[3];
                    pbVar9 = pbVar16 + 4;
                    if (""[bVar4] == '\0') goto LAB_0016090a;
                    pbVar16 = pbVar16 + 3;
                  }
                  else {
                    pbVar16 = pbVar16 + 2;
                  }
                }
                else {
                  pbVar16 = pbVar16 + 1;
                }
              }
              goto LAB_001609ee;
            }
LAB_0016090a:
            pbVar16 = pbVar9;
            pbVar9 = pbVar16;
            if (pbVar16 < pbVar2) {
              bVar4 = *pbVar16;
              if (""[bVar4] == '\0') {
                lVar11 = (long)local_48 - (long)pbVar16;
                do {
                  pbVar9 = pbVar2;
                  if (lVar11 == 0) goto LAB_001609f6;
                  pbVar16 = pbVar16 + 1;
                  bVar4 = *pbVar16;
                  lVar11 = lVar11 + -1;
                } while (""[bVar4] == '\0');
              }
              goto LAB_001609ee;
            }
          }
          else {
LAB_001609ee:
            pbVar9 = pbVar16;
            if (bVar4 == 0x22) goto LAB_00160a7a;
          }
LAB_001609f6:
          pbVar16 = pbVar9 + 2;
          if (pbVar2 <= pbVar9 + 2) break;
        } while( true );
      }
      goto LAB_00160ce9;
    case 0x23:
switchD_001603b0_caseD_23:
      pbVar9 = (byte *)memchr(buffer,10,(long)pbVar2 - (long)buffer);
      if (pbVar9 != (byte *)0x0) goto LAB_00160a72;
      goto LAB_00160ce9;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      goto switchD_001603b0_caseD_24;
    case 0x2d:
    case 0x2e:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x45:
    case 0x49:
switchD_001603b0_caseD_2d:
      local_58 = (byte *)buffer;
      uVar17 = fio_atol((char **)&local_58);
      if (local_58 <= pbVar2) {
        if ((local_58 == (byte *)0x0) || (""[*local_58] != '\0')) {
          local_58 = (byte *)buffer;
          num = fio_atof((char **)&local_58);
          if (pbVar2 < local_58) goto LAB_00160ce9;
          if ((local_58 == (byte *)0x0) || (""[*local_58] != '\0')) goto switchD_001603b0_caseD_24;
          jVar7 = (json_parser_s)fiobj_float_new(num);
        }
        else if ((long)(uVar17 + 0x4000000000000000) < 0) {
          jVar7 = (json_parser_s)fiobj_num_new_bignum(uVar17);
        }
        else {
          jVar7 = (json_parser_s)((uVar17 * 2 | uVar17 & 0x8000000000000000) + 1);
        }
        jVar8 = parser[2];
        pbVar9 = local_58;
        if (jVar8 == (json_parser_s)0x0) {
          parser[2] = jVar7;
        }
        else if ((char)parser[8].dict == '\0') {
          fiobj_ary_push((FIOBJ)jVar8,(FIOBJ)jVar7);
          pbVar9 = local_58;
        }
        else if (parser[1] == (json_parser_s)0x0) {
          parser[1] = jVar7;
        }
        else {
          fiobj_hash_set((FIOBJ)jVar8,(FIOBJ)parser[1],(FIOBJ)jVar7);
          fiobj_free((FIOBJ)parser[1]);
          parser[1].dict = 0;
          parser[1].depth = '\0';
          parser[1].key = '\0';
          *(undefined2 *)&parser[1].field_0x6 = 0;
          pbVar9 = local_58;
        }
        break;
      }
      goto LAB_00160ce9;
    case 0x2f:
      if (((byte *)buffer)[1] == 0x2f) goto switchD_001603b0_caseD_23;
      if (((byte *)buffer)[1] != 0x2a) goto switchD_001603b0_caseD_24;
      if ((byte *)buffer + 4 <= pbVar2) {
        pbVar9 = (byte *)buffer + 3;
        do {
          pbVar9 = (byte *)memchr(pbVar9,0x2f,(long)pbVar2 - (long)pbVar9);
          if (pbVar9 == (byte *)0x0) goto LAB_00160ce9;
        } while (pbVar9[-1] != 0x2a);
LAB_00160a72:
        pbVar9 = pbVar9 + 1;
        goto LAB_00160cc5;
      }
      goto LAB_00160ce9;
    case 0x4e:
switchD_001603b0_caseD_4e:
      pbVar9 = (byte *)buffer + 2;
      if (((pbVar9 <= pbVar2) && ((((byte *)buffer)[1] & 0xdf) == 0x41)) &&
         ((*pbVar9 & 0xdf) == 0x4e)) goto switchD_001603b0_caseD_2d;
      if (pbVar2 <= (byte *)buffer + 3) goto LAB_00160ce9;
      if (((((byte *)buffer)[1] != 0x75) || (*pbVar9 != 0x6c)) || (((byte *)buffer)[3] != 0x6c))
      goto switchD_001603b0_caseD_24;
      fio_json_on_null(parser);
LAB_00160639:
      pbVar9 = (byte *)buffer + 4;
      break;
    default:
      if (((bVar4 != 0x5b) || (parser->key != '\0')) ||
         ((bVar4 = parser->depth + 1, parser->depth = bVar4, 0x1f < bVar4 ||
          (parser->dict = parser->dict << 1, parser[3] != (json_parser_s)0x0))))
      goto switchD_001603b0_caseD_24;
      jVar8 = (json_parser_s)fiobj_ary_new();
      jVar7 = parser[2];
      if (jVar7 == (json_parser_s)0x0) {
        parser[2] = jVar8;
      }
      else if ((char)parser[8].dict == '\0') {
        fiobj_ary_push((FIOBJ)jVar7,(FIOBJ)jVar8);
      }
      else if (parser[1] == (json_parser_s)0x0) {
        parser[1] = jVar8;
      }
      else {
        fiobj_hash_set((FIOBJ)jVar7,(FIOBJ)parser[1],(FIOBJ)jVar8);
        fiobj_free((FIOBJ)parser[1]);
        parser[1].dict = 0;
        parser[1].depth = '\0';
        parser[1].key = '\0';
        *(undefined2 *)&parser[1].field_0x6 = 0;
      }
      jVar7 = parser[2];
      jVar13 = parser[5];
      if (((ulong)parser[6] <= (ulong)jVar13) &&
         (local_50 = jVar8, (ulong)parser[6] <= (long)jVar13 + 5U)) {
        uVar17 = (long)jVar13 + 5U & 0xfffffffffffffffe;
        jVar8 = (json_parser_s)fio_realloc2((void *)parser[7],uVar17 * 8 + 0x10,(long)jVar13 << 3);
        parser[7] = jVar8;
        if (jVar8 == (json_parser_s)0x0) goto LAB_00160d47;
        parser[6] = (json_parser_s)(uVar17 + 2);
        jVar13 = parser[5];
        jVar8 = local_50;
      }
      if (*pjVar1 == jVar13) {
        *(undefined1 (*) [16])pjVar1 = (undefined1  [16])0x0;
        jVar13.dict = 0;
        jVar13.depth = '\0';
        jVar13.key = '\0';
        jVar13._6_2_ = 0;
      }
      *(json_parser_s *)((long)parser[7] + (long)jVar13 * 8) = jVar7;
      parser[5] = (json_parser_s)((long)parser[5] + 1);
      parser[2] = jVar8;
      *(undefined1 *)&parser[8].dict = 0;
      pbVar9 = (byte *)buffer + 1;
    }
  }
  else {
    switch(bVar4) {
    case 0x65:
    case 0x69:
      goto switchD_001603b0_caseD_2d;
    case 0x66:
      if ((byte *)buffer + 4 < pbVar2) {
        if (((((byte *)buffer)[1] != 0x61) || (((byte *)buffer)[2] != 0x6c)) ||
           ((((byte *)buffer)[3] != 0x73 || (((byte *)buffer)[4] != 0x65))))
        goto switchD_001603b0_caseD_24;
        jVar7 = parser[2];
        if (jVar7 == (json_parser_s)0x0) {
          parser[2].dict = 0x26;
          parser[2].depth = '\0';
          parser[2].key = '\0';
          *(undefined2 *)&parser[2].field_0x6 = 0;
        }
        else if ((char)parser[8].dict == '\0') {
          fiobj_ary_push((FIOBJ)jVar7,0x26);
        }
        else if (parser[1] == (json_parser_s)0x0) {
          parser[1].dict = 0x26;
          parser[1].depth = '\0';
          parser[1].key = '\0';
          *(undefined2 *)&parser[1].field_0x6 = 0;
        }
        else {
          fiobj_hash_set((FIOBJ)jVar7,(FIOBJ)parser[1],0x26);
          fiobj_free((FIOBJ)parser[1]);
          parser[1].dict = 0;
          parser[1].depth = '\0';
          parser[1].key = '\0';
          *(undefined2 *)&parser[1].field_0x6 = 0;
        }
        pbVar9 = (byte *)buffer + 5;
        break;
      }
      goto LAB_00160ce9;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_001603b0_caseD_24;
    case 0x6e:
      goto switchD_001603b0_caseD_4e;
    default:
      switch(bVar4) {
      case 0x74:
        if ((byte *)buffer + 3 < pbVar2) {
          if (((((byte *)buffer)[1] != 0x72) || (((byte *)buffer)[2] != 0x75)) ||
             (((byte *)buffer)[3] != 0x65)) goto switchD_001603b0_caseD_24;
          jVar7 = parser[2];
          if (jVar7 == (json_parser_s)0x0) {
            parser[2].dict = 0x16;
            parser[2].depth = '\0';
            parser[2].key = '\0';
            *(undefined2 *)&parser[2].field_0x6 = 0;
          }
          else if ((char)parser[8].dict == '\0') {
            fiobj_ary_push((FIOBJ)jVar7,0x16);
          }
          else if (parser[1] == (json_parser_s)0x0) {
            parser[1].dict = 0x16;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
          else {
            fiobj_hash_set((FIOBJ)jVar7,(FIOBJ)parser[1],0x16);
            fiobj_free((FIOBJ)parser[1]);
            parser[1].dict = 0;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
          goto LAB_00160639;
        }
        goto LAB_00160ce9;
      case 0x75:
      case 0x76:
      case 0x77:
      case 0x79:
      case 0x7a:
      case 0x7c:
        goto switchD_001603b0_caseD_24;
      case 0x78:
        goto switchD_001603b0_caseD_2d;
      case 0x7b:
        if ((parser->key != '\0') ||
           (bVar4 = parser->depth + 1, parser->depth = bVar4, 0x1f < bVar4))
        goto switchD_001603b0_caseD_24;
        parser->dict = parser->dict * 2 + 1;
        if (parser[3] == (json_parser_s)0x0) {
          jVar8 = (json_parser_s)fiobj_hash_new();
          jVar7 = parser[2];
          if (jVar7 == (json_parser_s)0x0) {
            parser[2] = jVar8;
          }
          else if ((char)parser[8].dict == '\0') {
            fiobj_ary_push((FIOBJ)jVar7,(FIOBJ)jVar8);
          }
          else if (parser[1] == (json_parser_s)0x0) {
            parser[1] = jVar8;
          }
          else {
            fiobj_hash_set((FIOBJ)jVar7,(FIOBJ)parser[1],(FIOBJ)jVar8);
            fiobj_free((FIOBJ)parser[1]);
            parser[1].dict = 0;
            parser[1].depth = '\0';
            parser[1].key = '\0';
            *(undefined2 *)&parser[1].field_0x6 = 0;
          }
          jVar7 = parser[2];
          jVar14 = parser[5];
          if (((ulong)parser[6] <= (ulong)jVar14) &&
             (local_50 = jVar8, (ulong)parser[6] <= (long)jVar14 + 5U)) {
            uVar17 = (long)jVar14 + 5U & 0xfffffffffffffffe;
            jVar8 = (json_parser_s)
                    fio_realloc2((void *)parser[7],uVar17 * 8 + 0x10,(long)jVar14 << 3);
            parser[7] = jVar8;
            if (jVar8 == (json_parser_s)0x0) goto LAB_00160d47;
            parser[6] = (json_parser_s)(uVar17 + 2);
            jVar14 = parser[5];
            jVar8 = local_50;
          }
          if (*pjVar1 == jVar14) {
            *(undefined1 (*) [16])pjVar1 = (undefined1  [16])0x0;
            jVar14.dict = 0;
            jVar14.depth = '\0';
            jVar14.key = '\0';
            jVar14._6_2_ = 0;
          }
          *(json_parser_s *)((long)parser[7] + (long)jVar14 * 8) = jVar7;
          parser[5] = (json_parser_s)((long)parser[5] + 1);
          parser[2] = jVar8;
        }
        else {
          jVar7 = parser[2];
          jVar8 = parser[5];
          if (((ulong)parser[6] <= (ulong)jVar8) && ((ulong)parser[6] <= (long)jVar8 + 5U)) {
            uVar17 = (long)jVar8 + 5U & 0xfffffffffffffffe;
            jVar8 = (json_parser_s)
                    fio_realloc2((void *)parser[7],uVar17 * 8 + 0x10,(long)jVar8 << 3);
            parser[7] = jVar8;
            if (jVar8 == (json_parser_s)0x0) {
LAB_00160d47:
              if (0 < FIO_LOG_LEVEL) {
                FIO_LOG2STDERR(
                              "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.h:4920"
                              );
              }
              kill(0,2);
              piVar10 = __errno_location();
              exit(*piVar10);
            }
            parser[6] = (json_parser_s)(uVar17 + 2);
            jVar8 = parser[5];
          }
          if (*pjVar1 == jVar8) {
            *(undefined1 (*) [16])pjVar1 = (undefined1  [16])0x0;
            jVar8.dict = 0;
            jVar8.depth = '\0';
            jVar8.key = '\0';
            jVar8._6_2_ = 0;
          }
          *(json_parser_s *)((long)parser[7] + (long)jVar8 * 8) = jVar7;
          parser[5] = (json_parser_s)((long)parser[5] + 1);
          parser[2] = parser[3];
          parser[3].dict = 0;
          parser[3].depth = '\0';
          parser[3].key = '\0';
          *(undefined2 *)&parser[3].field_0x6 = 0;
        }
        *(undefined1 *)&parser[8].dict = 1;
        pbVar9 = (byte *)buffer + 1;
        goto LAB_00160cb5;
      case 0x7d:
        uVar6 = parser->dict;
        if ((uVar6 & 1) == 0) goto switchD_001603b0_caseD_24;
        if (parser->key == '\0') {
          fio_json_on_null(parser);
          uVar6 = parser->dict;
        }
        parser->depth = parser->depth + 0xff;
        parser->dict = uVar6 >> 1;
        jVar7 = parser[1];
        if (jVar7 != (json_parser_s)0x0) {
          if (2 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR("WARNING: (JSON parsing) malformed JSON, ignoring dangling Hash key.");
            jVar7 = parser[1];
          }
          fiobj_free((FIOBJ)jVar7);
          parser[1].dict = 0;
          parser[1].depth = '\0';
          parser[1].key = '\0';
          *(undefined2 *)&parser[1].field_0x6 = 0;
        }
        break;
      default:
        if ((bVar4 != 0x5d) || ((parser->dict & 1) != 0)) goto switchD_001603b0_caseD_24;
        parser->depth = parser->depth + 0xff;
        parser->dict = parser->dict >> 1;
      }
      parser[2].dict = 0;
      parser[2].depth = '\0';
      parser[2].key = '\0';
      *(undefined2 *)&parser[2].field_0x6 = 0;
      jVar7 = parser[5];
      if (jVar7 == parser[4]) {
        bVar19 = false;
      }
      else {
        parser[5] = (json_parser_s)((long)jVar7 + -1);
        jVar7 = *(json_parser_s *)((long)parser[7] + -8 + (long)jVar7 * 8);
        parser[2] = jVar7;
        bVar19 = (jVar7.dict & 7) == 4;
      }
      *(bool *)&parser[8].dict = bVar19;
      pbVar9 = (byte *)buffer + 1;
    }
  }
LAB_00160cb5:
  pbVar18 = pbVar9;
  if (parser->depth == '\0') goto LAB_00160ce9;
  parser->key = (byte)parser->dict & 1;
LAB_00160cc5:
  pbVar18 = pbVar9;
  buffer = (char *)pbVar9;
  if (pbVar2 <= pbVar9) {
LAB_00160ce9:
    return (long)pbVar18 - (long)local_38;
  }
  goto LAB_0016036a;
LAB_00160a7a:
  if (parser->key != '\0') {
    pbVar9 = pbVar16 + 1;
    do {
      if (pbVar2 <= pbVar9) goto LAB_00160ce9;
      bVar4 = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (""[bVar4] != '\0');
    if (bVar4 != 0x3a) {
switchD_001603b0_caseD_24:
      if (parser[5] == parser[4]) {
        o = 0;
      }
      else {
        o = *(FIOBJ *)((long)parser[7] + (long)parser[4] * 8);
      }
      fiobj_free(o);
      fiobj_free((FIOBJ)parser[1]);
      fio_free((void *)parser[7]);
      *(undefined1 (*) [16])(parser + 6) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(parser + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(parser + 2) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])parser = (undefined1  [16])0x0;
      parser[8].dict = 0;
      parser[8].depth = '\0';
      parser[8].key = '\0';
      *(undefined2 *)&parser[8].field_0x6 = 0;
      return 0;
    }
    fio_json_on_string(parser,start,(long)pbVar16 - (long)start);
    parser->key = '\0';
    goto LAB_00160cc5;
  }
  fio_json_on_string(parser,start,(long)pbVar16 - (long)start);
  pbVar9 = pbVar16 + 1;
  goto LAB_00160cb5;
}

Assistant:

static size_t __attribute__((unused))
fio_json_parse(json_parser_s *parser, const char *buffer, size_t length) {
  if (!length || !buffer)
    return 0;
  uint8_t *pos = (uint8_t *)buffer;
  const uint8_t *limit = pos + length;
  do {
    while (pos < limit && JSON_SEPERATOR[*pos])
      ++pos;
    if (pos == limit)
      goto stop;
    switch (*pos) {
    case '"': {
      uint8_t *tmp = pos + 1;
      if (seek2eos(&tmp, limit) == 0)
        goto stop;
      if (parser->key) {
        uint8_t *key = tmp + 1;
        while (key < limit && JSON_SEPERATOR[*key])
          ++key;
        if (key >= limit)
          goto stop;
        if (*key != ':')
          goto error;
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = key + 1;
        parser->key = 0;
        continue; /* skip tests */
      } else {
        ++pos;
        fio_json_on_string(parser, pos, (uintptr_t)(tmp - pos));
        pos = tmp + 1;
      }
      break;
    }
    case '{':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be a Hash.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      parser->dict = (parser->dict << 1) | 1;
      ++pos;
      if (fio_json_on_start_object(parser))
        goto error;
      break;
    case '}':
      if ((parser->dict & 1) == 0) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure error.\n");
#endif
        goto error;
      }
      if (!parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON dictionary closure missing key value.\n");
        goto error;
#endif
        fio_json_on_null(parser); /* append NULL and recuperate from error. */
      }
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_object(parser);
      break;
    case '[':
      if (parser->key) {
#if DEBUG
        fprintf(stderr, "ERROR: JSON key can't be an array.\n");
#endif
        goto error;
      }
      ++parser->depth;
      if (parser->depth >= JSON_MAX_DEPTH)
        goto error;
      ++pos;
      parser->dict = (parser->dict << 1);
      if (fio_json_on_start_array(parser))
        goto error;
      break;
    case ']':
      if ((parser->dict & 1))
        goto error;
      --parser->depth;
      ++pos;
      parser->dict = (parser->dict >> 1);
      fio_json_on_end_array(parser);
      break;
    case 't':
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'r' && pos[2] == 'u' && pos[3] == 'e')
        fio_json_on_true(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'N': /* overflow */
    case 'n':
      if (pos + 2 <= limit && (pos[1] | 32) == 'a' && (pos[2] | 32) == 'n')
        goto numeral;
      if (pos + 3 >= limit)
        goto stop;
      if (pos[1] == 'u' && pos[2] == 'l' && pos[3] == 'l')
        fio_json_on_null(parser);
      else
        goto error;
      pos += 4;
      break;
    case 'f':
      if (pos + 4 >= limit)
        goto stop;
      if (pos + 4 < limit && pos[1] == 'a' && pos[2] == 'l' && pos[3] == 's' &&
          pos[4] == 'e')
        fio_json_on_false(parser);
      else
        goto error;
      pos += 5;
      break;
    case '-': /* overflow */
    case '0': /* overflow */
    case '1': /* overflow */
    case '2': /* overflow */
    case '3': /* overflow */
    case '4': /* overflow */
    case '5': /* overflow */
    case '6': /* overflow */
    case '7': /* overflow */
    case '8': /* overflow */
    case '9': /* overflow */
    case '.': /* overflow */
    case 'e': /* overflow */
    case 'E': /* overflow */
    case 'x': /* overflow */
    case 'i': /* overflow */
    case 'I': /* overflow */
    numeral : {
      uint8_t *tmp = pos;
      long long i = fio_atol((char **)&tmp);
      if (tmp > limit)
        goto stop;
      if (!tmp || JSON_NUMERAL[*tmp]) {
        tmp = pos;
        double f = fio_atof((char **)&tmp);
        if (tmp > limit)
          goto stop;
        if (!tmp || JSON_NUMERAL[*tmp])
          goto error;
        fio_json_on_float(parser, f);
        pos = tmp;
      } else {
        fio_json_on_number(parser, i);
        pos = tmp;
      }
      break;
    }
    case '#': /* Ruby style comment */
    {
      uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
      if (!tmp)
        goto stop;
      pos = tmp + 1;
      continue; /* skip tests */
      ;
    }
    case '/': /* C style / Javascript style comment */
      if (pos[1] == '*') {
        if (pos + 4 > limit)
          goto stop;
        uint8_t *tmp = pos + 3; /* avoid this: /*/
        do {
          tmp = memchr(tmp, '/', (uintptr_t)(limit - tmp));
        } while (tmp && tmp[-1] != '*');
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else if (pos[1] == '/') {
        uint8_t *tmp = memchr(pos, '\n', (uintptr_t)(limit - pos));
        if (!tmp)
          goto stop;
        pos = tmp + 1;
      } else
        goto error;
      continue; /* skip tests */
      ;
    default:
      goto error;
    }
    if (parser->depth == 0) {
      fio_json_on_json(parser);
      goto stop;
    }
    parser->key = (parser->dict & 1);
  } while (pos < limit);
stop:
  return (size_t)((uintptr_t)pos - (uintptr_t)buffer);
error:
  fio_json_on_error(parser);
  return 0;
}